

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

void __thiscall QMenuBarPrivate::_q_internalShortcutActivated(QMenuBarPrivate *this,int id)

{
  QAction *this_00;
  int iVar1;
  QMenu *pQVar2;
  QPlatformMenu *pQVar3;
  QWindow *pQVar4;
  QWidget *ptr;
  QStyle *pQVar5;
  QWidget *pQVar6;
  
  this_00 = (this->super_QWidgetPrivate).actions.d.ptr[id];
  if (this_00 == (QAction *)0x0) {
    pQVar6 = QApplication::focusWidget();
    QWeakPointer<QObject>::assign<QObject>(&(this->keyboardFocusWidget).wp,&pQVar6->super_QObject);
    setCurrentAction(this,(QAction *)0x0,true,true);
    return;
  }
  pQVar6 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar2 = QAction::menu<QMenu*>(this_00);
  if (pQVar2 != (QMenu *)0x0) {
    pQVar2 = QAction::menu<QMenu*>(this_00);
    pQVar3 = QMenu::platformMenu(pQVar2);
    if (pQVar3 != (QPlatformMenu *)0x0) {
      pQVar4 = QWidget::windowHandle(pQVar6);
      (**(code **)(*(long *)pQVar3 + 0xd0))
                (pQVar3,pQVar4,(this->actionRects).d.ptr + id,0,*(code **)(*(long *)pQVar3 + 0xd0));
      return;
    }
  }
  ptr = QApplication::focusWidget();
  QWeakPointer<QObject>::assign<QObject>(&(this->keyboardFocusWidget).wp,&ptr->super_QObject);
  setCurrentAction(this,this_00,true,true);
  pQVar2 = QAction::menu<QMenu*>(this_00);
  if (pQVar2 != (QMenu *)0x0) {
    pQVar5 = QWidget::style(pQVar6);
    iVar1 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x12,0,pQVar6,0);
    if (iVar1 != 0) {
      setKeyboardMode(this,true);
      return;
    }
    return;
  }
  activateAction(this,this_00,Trigger);
  QBasicTimer::start(&this->autoReleaseTimer,(Duration)0x5f5e100,&pQVar6->super_QObject);
  return;
}

Assistant:

void QMenuBarPrivate::_q_internalShortcutActivated(int id)
{
    Q_Q(QMenuBar);
    QAction *act = actions.at(id);
    if (act && act->menu()) {
        if (QPlatformMenu *platformMenu = act->menu()->platformMenu()) {
            platformMenu->showPopup(q->windowHandle(), actionRects.at(id), nullptr);
            return;
        }
    }

    keyboardFocusWidget = QApplication::focusWidget();
    setCurrentAction(act, true, true);
    if (act && !act->menu()) {
        activateAction(act, QAction::Trigger);
        //100 is the same as the default value in QPushButton::animateClick
        autoReleaseTimer.start(100, q);
    } else if (act && q->style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, q)) {
        // When we open a menu using a shortcut, we should end up in keyboard state
        setKeyboardMode(true);
    }
}